

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::Parser::ParseServiceMethod
          (Parser *this,MethodDescriptorProto *method,LocationRecorder *method_location,
          FileDescriptorProto *containing_file)

{
  bool bVar1;
  string *psVar2;
  MethodOptions *mutable_options;
  LocationRecorder location;
  
  bVar1 = Consume(this,"rpc");
  if (bVar1) {
    LocationRecorder::LocationRecorder(&location,method_location,1);
    LocationRecorder::RecordLegacyLocation(&location,&method->super_Message,NAME);
    psVar2 = MethodDescriptorProto::mutable_name_abi_cxx11_(method);
    bVar1 = ConsumeIdentifier(this,psVar2,"Expected method name.");
    LocationRecorder::~LocationRecorder(&location);
    if ((bVar1) && (bVar1 = Consume(this,"("), bVar1)) {
      bVar1 = LookingAt(this,"stream");
      if (bVar1) {
        LocationRecorder::LocationRecorder(&location,method_location,5);
        LocationRecorder::RecordLegacyLocation(&location,&method->super_Message,OTHER);
        *(byte *)(method->_has_bits_).has_bits_ = (byte)(method->_has_bits_).has_bits_[0] | 0x10;
        method->client_streaming_ = true;
        bVar1 = Consume(this,"stream");
        LocationRecorder::~LocationRecorder(&location);
        if (!bVar1) {
          return false;
        }
      }
      LocationRecorder::LocationRecorder(&location,method_location,2);
      LocationRecorder::RecordLegacyLocation(&location,&method->super_Message,INPUT_TYPE);
      psVar2 = MethodDescriptorProto::mutable_input_type_abi_cxx11_(method);
      bVar1 = ParseUserDefinedType(this,psVar2);
      LocationRecorder::~LocationRecorder(&location);
      if ((((bVar1) && (bVar1 = Consume(this,")"), bVar1)) &&
          (bVar1 = Consume(this,"returns"), bVar1)) && (bVar1 = Consume(this,"("), bVar1)) {
        bVar1 = LookingAt(this,"stream");
        if (bVar1) {
          LocationRecorder::LocationRecorder(&location,method_location,6);
          LocationRecorder::RecordLegacyLocation(&location,&method->super_Message,OTHER);
          bVar1 = Consume(this,"stream");
          if (!bVar1) {
            LocationRecorder::~LocationRecorder(&location);
            return false;
          }
          *(byte *)(method->_has_bits_).has_bits_ = (byte)(method->_has_bits_).has_bits_[0] | 0x20;
          method->server_streaming_ = true;
          LocationRecorder::~LocationRecorder(&location);
        }
        LocationRecorder::LocationRecorder(&location,method_location,3);
        LocationRecorder::RecordLegacyLocation(&location,&method->super_Message,OUTPUT_TYPE);
        psVar2 = MethodDescriptorProto::mutable_output_type_abi_cxx11_(method);
        bVar1 = ParseUserDefinedType(this,psVar2);
        LocationRecorder::~LocationRecorder(&location);
        if ((bVar1) && (bVar1 = Consume(this,")"), bVar1)) {
          bVar1 = LookingAt(this,"{");
          if (bVar1) {
            mutable_options = MethodDescriptorProto::mutable_options(method);
            bVar1 = ParseMethodOptions(this,method_location,containing_file,4,
                                       &mutable_options->super_Message);
          }
          else {
            bVar1 = ConsumeEndOfDeclaration(this,";",method_location);
          }
          if (bVar1 != false) {
            return true;
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool Parser::ParseServiceMethod(MethodDescriptorProto* method,
                                const LocationRecorder& method_location,
                                const FileDescriptorProto* containing_file) {
  DO(Consume("rpc"));

  {
    LocationRecorder location(method_location,
                              MethodDescriptorProto::kNameFieldNumber);
    location.RecordLegacyLocation(
        method, DescriptorPool::ErrorCollector::NAME);
    DO(ConsumeIdentifier(method->mutable_name(), "Expected method name."));
  }

  // Parse input type.
  DO(Consume("("));
  {
    if (LookingAt("stream")) {
      LocationRecorder location(
          method_location, MethodDescriptorProto::kClientStreamingFieldNumber);
      location.RecordLegacyLocation(
          method, DescriptorPool::ErrorCollector::OTHER);
      method->set_client_streaming(true);
      DO(Consume("stream"));

    }
    LocationRecorder location(method_location,
                              MethodDescriptorProto::kInputTypeFieldNumber);
    location.RecordLegacyLocation(
        method, DescriptorPool::ErrorCollector::INPUT_TYPE);
    DO(ParseUserDefinedType(method->mutable_input_type()));
  }
  DO(Consume(")"));

  // Parse output type.
  DO(Consume("returns"));
  DO(Consume("("));
  {
    if (LookingAt("stream")) {
      LocationRecorder location(
          method_location, MethodDescriptorProto::kServerStreamingFieldNumber);
      location.RecordLegacyLocation(
          method, DescriptorPool::ErrorCollector::OTHER);
      DO(Consume("stream"));
      method->set_server_streaming(true);

    }
    LocationRecorder location(method_location,
                              MethodDescriptorProto::kOutputTypeFieldNumber);
    location.RecordLegacyLocation(
        method, DescriptorPool::ErrorCollector::OUTPUT_TYPE);
    DO(ParseUserDefinedType(method->mutable_output_type()));
  }
  DO(Consume(")"));

  if (LookingAt("{")) {
    // Options!
    DO(ParseMethodOptions(method_location, containing_file,
                          MethodDescriptorProto::kOptionsFieldNumber,
                          method->mutable_options()));
  } else {
    DO(ConsumeEndOfDeclaration(";", &method_location));
  }

  return true;
}